

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyclichash.h
# Opt level: O3

uint __thiscall
CyclicHash<unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (CyclicHash<unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  bool bVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  _Elt_pointer puVar8;
  ulong uVar9;
  ulong uVar10;
  
  ppuVar1 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar2 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppuVar3 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar8 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last +
           (long)((c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_cur +
                 (((((ulong)((long)ppuVar1 - (long)ppuVar3) >> 3) - 1) +
                  (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                 (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                       .super__Deque_impl_data._M_finish._M_first));
  uVar5 = 0;
  if (puVar8 != puVar2) {
    uVar9 = (long)puVar2 -
            (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_first;
    uVar5 = 0;
    uVar10 = 0;
    uVar7 = 1;
    do {
      if ((long)uVar9 < 0) {
        uVar10 = (long)uVar9 >> 9;
LAB_00109409:
        pbVar6 = ppuVar3[uVar10] + uVar9 + uVar10 * -0x200;
      }
      else {
        if (0x1ff < uVar9) {
          uVar10 = uVar9 >> 9;
          goto LAB_00109409;
        }
        pbVar6 = puVar2 + uVar10;
      }
      uVar5 = (uVar5 >> ((char)*(undefined4 *)(this + 8) - 1U & 0x1f) |
              (uVar5 & *(uint *)(this + 0x40c)) * 2) ^ *(uint *)(this + (ulong)*pbVar6 * 4 + 0xc);
      uVar9 = uVar9 + 1;
      bVar4 = uVar7 < (ulong)((long)puVar8 - (long)puVar2);
      uVar10 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar4);
  }
  return uVar5;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      fastleftshift1(answer);
      answer ^= hasher.hashvalues[static_cast<unsigned int>(c[k])];
    }
    return answer;
  }